

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O2

Fodder * jsonnet::internal::concat_fodder(Fodder *__return_storage_ptr__,Fodder *a,Fodder *b)

{
  pointer pFVar1;
  pointer pFVar2;
  ulong uVar3;
  
  if ((a->
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (a->
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::vector(__return_storage_ptr__,b);
  }
  else {
    pFVar1 = (b->
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pFVar2 = (b->
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             )._M_impl.super__Vector_impl_data._M_start;
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::vector(__return_storage_ptr__,a);
    if (pFVar1 != pFVar2) {
      fodder_push_back(__return_storage_ptr__,
                       (b->
                       super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       )._M_impl.super__Vector_impl_data._M_start);
      uVar3 = 1;
      while( true ) {
        pFVar1 = (b->
                 super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)(((long)(b->
                           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pFVar1) / 0x28) <=
            uVar3) break;
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::push_back(__return_storage_ptr__,pFVar1 + uVar3);
        uVar3 = (ulong)((int)uVar3 + 1);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static inline Fodder concat_fodder(const Fodder &a, const Fodder &b)
{
    if (a.size() == 0)
        return b;
    if (b.size() == 0)
        return a;
    Fodder r = a;
    // Carefully add the first element of b.
    fodder_push_back(r, b[0]);
    // Add the rest of b.
    for (unsigned i = 1; i < b.size(); ++i) {
        r.push_back(b[i]);
    }
    return r;
}